

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3RenameTokenRemap(Parse *pParse,void *pTo,void *pFrom)

{
  RenameToken *local_28;
  RenameToken *p;
  void *pFrom_local;
  void *pTo_local;
  Parse *pParse_local;
  
  local_28 = pParse->pRename;
  while( true ) {
    if (local_28 == (RenameToken *)0x0) {
      return;
    }
    if (local_28->p == pFrom) break;
    local_28 = local_28->pNext;
  }
  local_28->p = pTo;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3RenameTokenRemap(Parse *pParse, void *pTo, void *pFrom){
  RenameToken *p;
  renameTokenCheckAll(pParse, pTo);
  for(p=pParse->pRename; p; p=p->pNext){
    if( p->p==pFrom ){
      p->p = pTo;
      break;
    }
  }
}